

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O1

void SequenceTaskCostToGo::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  Search::search::set_options
            (sch,Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES |
                 Search::EXAMPLES_DONT_CHANGE | Search::ACTION_COSTS);
  sch->task_data = num_actions;
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& /*options*/)
{
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      Search::ACTION_COSTS |          // we'll provide cost-per-action (rather than oracle)
      0);
  sch.set_task_data<size_t>(&num_actions);
}